

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.h
# Opt level: O3

bool __thiscall FIX::TimeRange::isInRange(TimeRange *this,UtcTimeStamp *dateTime)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  int M;
  int D;
  int Y;
  LocalTimeStamp localDateTime;
  long local_88;
  int local_7c;
  DateTime local_78;
  tm local_60;
  
  if (this[0x38] == (TimeRange)0x1) {
    local_88 = (dateTime->super_DateTime).m_time / 1000000000 +
               (long)(dateTime->super_DateTime).m_date * 0x15180 + -0x3118a41200;
    FIX::time_localtime((long *)&local_60);
    DateTime::fromTm(&local_78,&local_60,0);
    local_60.tm_hour = local_78.m_date;
    local_60.tm_mday = local_78._12_4_;
    uVar1 = local_60._8_8_;
    local_60.tm_mon = (undefined4)local_78.m_time;
    local_60.tm_year = local_78.m_time._4_4_;
    local_60._0_8_ = &PTR__DateTime_00324928;
    local_60.tm_hour = local_78.m_date;
    iVar3 = local_60.tm_hour;
    local_60._8_8_ = uVar1;
    DateTime::getYMD(iVar3,(int *)&local_78,(int *)&local_88,&local_7c);
    iVar3 = (int)local_88 + 10;
    if (2 < (int)local_88) {
      iVar3 = (int)local_88 + -2;
    }
    local_78._vptr_DateTime._0_4_ = (int)local_78._vptr_DateTime - (uint)((int)local_88 < 3);
    iVar4 = (int)((ulong)((long)(int)local_78._vptr_DateTime * -0x51eb851f) >> 0x20);
    cVar6 = (char)((int)local_78._vptr_DateTime % 100);
    iVar3 = (int)local_78._vptr_DateTime % 100 + local_7c + (int)local_78._vptr_DateTime / 400 +
            ((iVar4 >> 5) - (iVar4 >> 0x1f)) * 2 +
            (int)((char)(((byte)(cVar6 >> 7) >> 6) + cVar6) >> 2) +
            (int)((double)iVar3 * 2.6 + -0.2);
    iVar4 = iVar3 % 7;
    iVar3 = iVar3 % 7 + 7;
    if (-1 < iVar4) {
      iVar3 = iVar4;
    }
    dateTime = (UtcTimeStamp *)&local_60;
  }
  else {
    DateTime::getYMD((dateTime->super_DateTime).m_date,&local_60.tm_sec,(int *)&local_78,
                     (int *)&local_88);
    iVar3 = (int)local_78._vptr_DateTime + 10;
    if (2 < (int)local_78._vptr_DateTime) {
      iVar3 = (int)local_78._vptr_DateTime + -2;
    }
    iVar4 = local_60.tm_sec - (uint)((int)local_78._vptr_DateTime < 3);
    iVar5 = (int)((ulong)((long)iVar4 * -0x51eb851f) >> 0x20);
    cVar6 = (char)(iVar4 % 100);
    iVar3 = iVar4 % 100 + (int)local_88 + iVar4 / 400 + ((iVar5 >> 5) - (iVar5 >> 0x1f)) * 2 +
            (int)((char)(((byte)(cVar6 >> 7) >> 6) + cVar6) >> 2) +
            (int)((double)iVar3 * 2.6 + -0.2);
    iVar4 = iVar3 % 7;
    iVar3 = iVar3 % 7 + 7;
    if (-1 < iVar4) {
      iVar3 = iVar4;
    }
  }
  bVar2 = isInRange(this,&dateTime->super_DateTime,iVar3 + 1);
  return bVar2;
}

Assistant:

bool isInRange( const UtcTimeStamp& dateTime )
  {
    if( m_useLocalTime )
    {
      LocalTimeStamp localDateTime( dateTime.getTimeT() );
      return isInRange( localDateTime, localDateTime.getWeekDay() );
    }

    return isInRange( dateTime, dateTime.getWeekDay() );
  }